

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relation.cpp
# Opt level: O2

shared_ptr<duckdb::Relation,_true> __thiscall
duckdb::Relation::Aggregate
          (Relation *this,
          vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
          *expressions,string *group_list)

{
  ParserOptions options;
  element_type *peVar1;
  ClientContext *this_00;
  string *in_RCX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<duckdb::Relation,_true> sVar2;
  GroupByNode groups;
  ClientContextWrapper local_98;
  undefined1 local_80 [24];
  undefined8 uStack_68;
  vector<duckdb::ParserExtension,_true> *local_60;
  GroupByNode local_58;
  
  shared_ptr<duckdb::ClientContextWrapper,_true>::operator->
            ((shared_ptr<duckdb::ClientContextWrapper,_true> *)(expressions + 1));
  ClientContextWrapper::GetContext(&local_98);
  this_00 = shared_ptr<duckdb::ClientContext,_true>::operator->
                      ((shared_ptr<duckdb::ClientContext,_true> *)&local_98);
  ClientContext::GetParserOptions((ParserOptions *)(local_80 + 0x10),this_00);
  options.max_expression_depth = uStack_68;
  options.preserve_identifier_case = (bool)local_80[0x10];
  options.integer_division = (bool)local_80[0x11];
  options._2_6_ = local_80._18_6_;
  options.extensions = local_60;
  Parser::ParseGroupByList(&local_58,in_RCX,options);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_98.client_context);
  enable_shared_from_this<duckdb::Relation>::shared_from_this
            ((enable_shared_from_this<duckdb::Relation> *)local_80);
  make_shared_ptr<duckdb::AggregateRelation,duckdb::shared_ptr<duckdb::Relation,true>,duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,true>,duckdb::GroupByNode>
            ((shared_ptr<duckdb::Relation,_true> *)&local_98,
             (vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
              *)local_80,(GroupByNode *)group_list);
  peVar1 = local_98.client_context.internal.
           super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_98.client_context.internal.
  super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  this->_vptr_Relation = local_98._vptr_ClientContextWrapper;
  (this->super_enable_shared_from_this<duckdb::Relation>).__weak_this_.internal.
  super___weak_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)peVar1;
  local_98._vptr_ClientContextWrapper = (_func_int **)0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_98.client_context);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_80 + 8));
  GroupByNode::~GroupByNode(&local_58);
  sVar2.internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = extraout_RDX._M_pi;
  sVar2.internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (shared_ptr<duckdb::Relation,_true>)
         sVar2.internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

shared_ptr<Relation> Relation::Aggregate(vector<unique_ptr<ParsedExpression>> expressions, const string &group_list) {
	auto groups = Parser::ParseGroupByList(group_list, context->GetContext()->GetParserOptions());
	return make_shared_ptr<AggregateRelation>(shared_from_this(), std::move(expressions), std::move(groups));
}